

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
::destroyAll(DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
             *this)

{
  bool bVar1;
  uint uVar2;
  CancellationDelegate *RHS;
  CancellationDelegate *RHS_00;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *pDVar3;
  CancellationDelegate **ppCVar4;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *E;
  DenseSetPair<llbuild::core::CancellationDelegate_*> *P;
  CancellationDelegate *TombstoneKey;
  CancellationDelegate *EmptyKey;
  DenseMapBase<llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>
  *this_local;
  
  uVar2 = getNumBuckets(this);
  if (uVar2 != 0) {
    RHS = getEmptyKey();
    RHS_00 = getTombstoneKey();
    E = getBuckets(this);
    pDVar3 = getBucketsEnd(this);
    for (; E != pDVar3; E = E + 1) {
      ppCVar4 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(E);
      bVar1 = DenseMapInfo<llbuild::core::CancellationDelegate_*>::isEqual(*ppCVar4,RHS);
      if (!bVar1) {
        ppCVar4 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(E);
        bVar1 = DenseMapInfo<llbuild::core::CancellationDelegate_*>::isEqual(*ppCVar4,RHS_00);
        if (!bVar1) {
          detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getSecond(E);
        }
      }
      detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(E);
    }
  }
  return;
}

Assistant:

void destroyAll() {
    if (getNumBuckets() == 0) // Nothing to do.
      return;

    const KeyT EmptyKey = getEmptyKey(), TombstoneKey = getTombstoneKey();
    for (BucketT *P = getBuckets(), *E = getBucketsEnd(); P != E; ++P) {
      if (!KeyInfoT::isEqual(P->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(P->getFirst(), TombstoneKey))
        P->getSecond().~ValueT();
      P->getFirst().~KeyT();
    }
  }